

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_4bf6b6::HandleUploadCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  undefined1 *this_00;
  CURL_conflict *pCVar1;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  size_type sVar4;
  reference pbVar5;
  cmMakefile *pcVar6;
  string *psVar7;
  char *pcVar8;
  undefined8 uVar9;
  ulong uVar10;
  string_view sVar11;
  value_type local_a2a [2];
  string local_a28 [8];
  string log;
  cmAlphaNum local_a00;
  cmAlphaNum local_9d0;
  string local_9a0;
  string_view local_980;
  reference local_970;
  string *h;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  curl_slist *headers;
  string *local_928;
  string *netrc_option_err;
  allocator<char> local_8f9;
  undefined1 local_8f8 [8];
  string e_17;
  undefined1 local_8d0 [8];
  string e_16;
  undefined1 local_8a8 [8];
  string e_15;
  undefined1 local_880 [8];
  string e_14;
  undefined1 local_858 [8];
  string e_13;
  undefined1 local_830 [8];
  string e_12;
  cURLProgressHelper helper;
  undefined1 local_7d8 [8];
  string e_11;
  undefined1 local_7b0 [8];
  string e_10;
  undefined1 local_788 [8];
  string e_9;
  undefined1 local_760 [8];
  string e_8;
  undefined1 local_738 [8];
  string e_7;
  cmFileCommandVectorOfChar chunkDebug;
  cmFileCommandVectorOfChar chunkResponse;
  string *cainfo_err;
  undefined1 local_6b8 [8];
  string e_6;
  undefined1 local_690 [8];
  string e_5;
  undefined1 local_668 [8];
  string e_4;
  undefined1 local_640 [8];
  string e_3;
  undefined1 local_618 [8];
  string e_2;
  undefined1 local_5f0 [8];
  string e_1;
  undefined1 local_5c8 [8];
  string e;
  CURLcode res;
  cURLEasyGuard g_curl;
  string local_590;
  CURL_conflict *local_570;
  CURL *curl;
  string local_548;
  unsigned_long local_528;
  unsigned_long file_size;
  cmAlphaNum local_4f0;
  undefined1 local_4c0 [8];
  string errStr;
  FILE *fin;
  cmAlphaNum local_468;
  undefined1 local_438 [8];
  string err;
  string local_410;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3f0;
  allocator<char> local_3e1;
  string local_3e0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3c0;
  allocator<char> local_3b1;
  string local_3b0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_390;
  allocator<char> local_381;
  string local_380;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_360;
  allocator<char> local_351;
  string local_350;
  cmValue local_330;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_328;
  allocator<char> local_319;
  string local_318;
  string_view local_2f8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e8;
  allocator<char> local_2d9;
  string local_2d8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b8;
  allocator<char> local_2a9;
  string local_2a8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_288;
  allocator<char> local_279;
  string local_278;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_258;
  undefined4 local_250;
  allocator<char> local_249;
  string local_248;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_220;
  undefined1 local_218 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  curl_headers;
  string local_1f8;
  undefined1 local_1d8 [8];
  string netrc_file;
  string local_1b0;
  undefined1 local_190 [8];
  string netrc_level;
  string userpwd;
  string local_148;
  cmValue local_128;
  cmValue cainfo;
  string local_118;
  byte local_f2;
  byte local_f1;
  undefined1 local_f0 [6];
  bool tls_verify;
  bool showProgress;
  string statusVar;
  string logVar;
  long inactivity_timeout;
  long timeout;
  string url;
  string filename;
  const_iterator i;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar2 = local_20;
  if (sVar4 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"UPLOAD must be called with at least three arguments.",&local_41)
    ;
    cmExecutionStatus::SetError(pcVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
    goto LAB_0039bd30;
  }
  filename.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)status_local);
  this = (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)(&filename.field_2._M_allocated_capacity + 1);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(this);
  pbVar5 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(this);
  std::__cxx11::string::string((string *)(url.field_2._M_local_buf + 8),(string *)pbVar5);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(this);
  pbVar5 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(this);
  std::__cxx11::string::string((string *)&timeout,(string *)pbVar5);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&filename.field_2 + 8));
  inactivity_timeout = 0;
  logVar.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(statusVar.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_f0);
  local_f1 = 0;
  pcVar6 = cmExecutionStatus::GetMakefile(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CMAKE_TLS_VERIFY",(allocator<char> *)((long)&cainfo.Value + 7));
  bVar3 = cmMakefile::IsOn(pcVar6,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cainfo.Value + 7));
  local_f2 = bVar3;
  pcVar6 = cmExecutionStatus::GetMakefile(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"CMAKE_TLS_CAINFO",
             (allocator<char> *)(userpwd.field_2._M_local_buf + 0xf));
  local_128 = cmMakefile::GetDefinition(pcVar6,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)(userpwd.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(netrc_level.field_2._M_local_buf + 8));
  pcVar6 = cmExecutionStatus::GetMakefile(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"CMAKE_NETRC",
             (allocator<char> *)(netrc_file.field_2._M_local_buf + 0xf));
  psVar7 = cmMakefile::GetSafeDefinition(pcVar6,&local_1b0);
  std::__cxx11::string::string((string *)local_190,(string *)psVar7);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)(netrc_file.field_2._M_local_buf + 0xf));
  pcVar6 = cmExecutionStatus::GetMakefile(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"CMAKE_NETRC_FILE",
             (allocator<char> *)
             ((long)&curl_headers.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  psVar7 = cmMakefile::GetSafeDefinition(pcVar6,&local_1f8);
  std::__cxx11::string::string((string *)local_1d8,(string *)psVar7);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&curl_headers.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_218);
  while( true ) {
    local_220._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)status_local);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&filename.field_2 + 8),&local_220);
    if (!bVar3) break;
    pbVar5 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&filename.field_2 + 8));
    bVar3 = std::operator==(pbVar5,"TIMEOUT");
    if (bVar3) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&filename.field_2 + 8));
      local_228._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)status_local);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&filename.field_2 + 8),&local_228);
      pcVar2 = local_20;
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_248,"UPLOAD missing time for TIMEOUT.",&local_249);
        cmExecutionStatus::SetError(pcVar2,&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        std::allocator<char>::~allocator(&local_249);
        args_local._7_1_ = 0;
        local_250 = 1;
        goto LAB_0039bc72;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&filename.field_2 + 8));
      pcVar8 = (char *)std::__cxx11::string::c_str();
      inactivity_timeout = atol(pcVar8);
    }
    else {
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&filename.field_2 + 8));
      bVar3 = std::operator==(pbVar5,"INACTIVITY_TIMEOUT");
      if (bVar3) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&filename.field_2 + 8));
        local_258._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&filename.field_2 + 8),&local_258);
        pcVar2 = local_20;
        if (!bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_278,"UPLOAD missing time for INACTIVITY_TIMEOUT.",&local_279);
          cmExecutionStatus::SetError(pcVar2,&local_278);
          std::__cxx11::string::~string((string *)&local_278);
          std::allocator<char>::~allocator(&local_279);
          args_local._7_1_ = 0;
          local_250 = 1;
          goto LAB_0039bc72;
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&filename.field_2 + 8));
        pcVar8 = (char *)std::__cxx11::string::c_str();
        logVar.field_2._8_8_ = atol(pcVar8);
      }
      else {
        pbVar5 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&filename.field_2 + 8));
        bVar3 = std::operator==(pbVar5,"LOG");
        if (bVar3) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&filename.field_2 + 8));
          local_288._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local);
          bVar3 = __gnu_cxx::operator==
                            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&filename.field_2 + 8),&local_288);
          pcVar2 = local_20;
          if (bVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2a8,"UPLOAD missing VAR for LOG.",&local_2a9);
            cmExecutionStatus::SetError(pcVar2,&local_2a8);
            std::__cxx11::string::~string((string *)&local_2a8);
            std::allocator<char>::~allocator(&local_2a9);
            args_local._7_1_ = 0;
            local_250 = 1;
            goto LAB_0039bc72;
          }
          pbVar5 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&filename.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)(statusVar.field_2._M_local_buf + 8),(string *)pbVar5);
        }
        else {
          pbVar5 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&filename.field_2 + 8));
          bVar3 = std::operator==(pbVar5,"STATUS");
          if (bVar3) {
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&filename.field_2 + 8));
            local_2b8._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local);
            bVar3 = __gnu_cxx::operator==
                              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&filename.field_2 + 8),&local_2b8);
            pcVar2 = local_20;
            if (bVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2d8,"UPLOAD missing VAR for STATUS.",&local_2d9);
              cmExecutionStatus::SetError(pcVar2,&local_2d8);
              std::__cxx11::string::~string((string *)&local_2d8);
              std::allocator<char>::~allocator(&local_2d9);
              args_local._7_1_ = 0;
              local_250 = 1;
              goto LAB_0039bc72;
            }
            pbVar5 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&filename.field_2 + 8));
            std::__cxx11::string::operator=((string *)local_f0,(string *)pbVar5);
          }
          else {
            pbVar5 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&filename.field_2 + 8));
            bVar3 = std::operator==(pbVar5,"SHOW_PROGRESS");
            if (bVar3) {
              local_f1 = 1;
            }
            else {
              pbVar5 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&filename.field_2 + 8));
              bVar3 = std::operator==(pbVar5,"TLS_VERIFY");
              if (bVar3) {
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&filename.field_2 + 8));
                local_2e8._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local);
                bVar3 = __gnu_cxx::operator!=
                                  ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&filename.field_2 + 8),&local_2e8);
                pcVar2 = local_20;
                if (!bVar3) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_318,"UPLOAD missing bool value for TLS_VERIFY.",
                             &local_319);
                  cmExecutionStatus::SetError(pcVar2,&local_318);
                  std::__cxx11::string::~string((string *)&local_318);
                  std::allocator<char>::~allocator(&local_319);
                  args_local._7_1_ = 0;
                  local_250 = 1;
                  goto LAB_0039bc72;
                }
                pbVar5 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&filename.field_2 + 8));
                sVar11 = (string_view)
                         std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar5);
                local_2f8 = sVar11;
                local_f2 = cmIsOn(sVar11);
              }
              else {
                pbVar5 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&filename.field_2 + 8));
                bVar3 = std::operator==(pbVar5,"TLS_CAINFO");
                if (bVar3) {
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&filename.field_2 + 8));
                  local_328._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)status_local);
                  bVar3 = __gnu_cxx::operator!=
                                    ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&filename.field_2 + 8),&local_328);
                  pcVar2 = local_20;
                  if (!bVar3) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_350,"UPLOAD missing file value for TLS_CAINFO.",
                               &local_351);
                    cmExecutionStatus::SetError(pcVar2,&local_350);
                    std::__cxx11::string::~string((string *)&local_350);
                    std::allocator<char>::~allocator(&local_351);
                    args_local._7_1_ = 0;
                    local_250 = 1;
                    goto LAB_0039bc72;
                  }
                  pbVar5 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)((long)&filename.field_2 + 8));
                  cmValue::cmValue(&local_330,pbVar5);
                  local_128.Value = local_330.Value;
                }
                else {
                  pbVar5 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)((long)&filename.field_2 + 8));
                  bVar3 = std::operator==(pbVar5,"NETRC_FILE");
                  if (bVar3) {
                    __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&filename.field_2 + 8));
                    local_360._M_current =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)status_local);
                    bVar3 = __gnu_cxx::operator!=
                                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)((long)&filename.field_2 + 8),&local_360);
                    pcVar2 = local_20;
                    if (!bVar3) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_380,"UPLOAD missing file value for NETRC_FILE.",
                                 &local_381);
                      cmExecutionStatus::SetError(pcVar2,&local_380);
                      std::__cxx11::string::~string((string *)&local_380);
                      std::allocator<char>::~allocator(&local_381);
                      args_local._7_1_ = 0;
                      local_250 = 1;
                      goto LAB_0039bc72;
                    }
                    pbVar5 = __gnu_cxx::
                             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)((long)&filename.field_2 + 8));
                    std::__cxx11::string::operator=((string *)local_1d8,(string *)pbVar5);
                  }
                  else {
                    pbVar5 = __gnu_cxx::
                             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)((long)&filename.field_2 + 8));
                    bVar3 = std::operator==(pbVar5,"NETRC");
                    if (bVar3) {
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&filename.field_2 + 8));
                      local_390._M_current =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)status_local);
                      bVar3 = __gnu_cxx::operator!=
                                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)((long)&filename.field_2 + 8),&local_390);
                      pcVar2 = local_20;
                      if (!bVar3) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_3b0,"UPLOAD missing level value for NETRC.",
                                   &local_3b1);
                        cmExecutionStatus::SetError(pcVar2,&local_3b0);
                        std::__cxx11::string::~string((string *)&local_3b0);
                        std::allocator<char>::~allocator(&local_3b1);
                        args_local._7_1_ = 0;
                        local_250 = 1;
                        goto LAB_0039bc72;
                      }
                      pbVar5 = __gnu_cxx::
                               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)((long)&filename.field_2 + 8));
                      std::__cxx11::string::operator=((string *)local_190,(string *)pbVar5);
                    }
                    else {
                      pbVar5 = __gnu_cxx::
                               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)((long)&filename.field_2 + 8));
                      bVar3 = std::operator==(pbVar5,"USERPWD");
                      if (bVar3) {
                        __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&filename.field_2 + 8));
                        local_3c0._M_current =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)status_local);
                        bVar3 = __gnu_cxx::operator==
                                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)((long)&filename.field_2 + 8),&local_3c0);
                        pcVar2 = local_20;
                        if (bVar3) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_3e0,"UPLOAD missing string for USERPWD.",
                                     &local_3e1);
                          cmExecutionStatus::SetError(pcVar2,&local_3e0);
                          std::__cxx11::string::~string((string *)&local_3e0);
                          std::allocator<char>::~allocator(&local_3e1);
                          args_local._7_1_ = 0;
                          local_250 = 1;
                          goto LAB_0039bc72;
                        }
                        pbVar5 = __gnu_cxx::
                                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              *)((long)&filename.field_2 + 8));
                        std::__cxx11::string::operator=
                                  ((string *)(netrc_level.field_2._M_local_buf + 8),(string *)pbVar5
                                  );
                      }
                      else {
                        pbVar5 = __gnu_cxx::
                                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              *)((long)&filename.field_2 + 8));
                        bVar3 = std::operator==(pbVar5,"HTTPHEADER");
                        if (bVar3) {
                          __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)((long)&filename.field_2 + 8));
                          local_3f0._M_current =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)status_local);
                          bVar3 = __gnu_cxx::operator==
                                            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              *)((long)&filename.field_2 + 8),&local_3f0);
                          pcVar2 = local_20;
                          if (bVar3) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_410,"UPLOAD missing string for HTTPHEADER.",
                                       (allocator<char> *)(err.field_2._M_local_buf + 0xf));
                            cmExecutionStatus::SetError(pcVar2,&local_410);
                            std::__cxx11::string::~string((string *)&local_410);
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)(err.field_2._M_local_buf + 0xf));
                            args_local._7_1_ = 0;
                            local_250 = 1;
                            goto LAB_0039bc72;
                          }
                          pbVar5 = __gnu_cxx::
                                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                *)((long)&filename.field_2 + 8));
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_218,pbVar5);
                        }
                        else {
                          cmAlphaNum::cmAlphaNum(&local_468,"Unexpected argument: ");
                          pbVar5 = __gnu_cxx::
                                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                *)((long)&filename.field_2 + 8));
                          cmAlphaNum::cmAlphaNum((cmAlphaNum *)&fin,pbVar5);
                          cmStrCat<>((string *)local_438,&local_468,(cmAlphaNum *)&fin);
                          pcVar6 = cmExecutionStatus::GetMakefile(local_20);
                          cmMakefile::IssueMessage(pcVar6,AUTHOR_WARNING,(string *)local_438);
                          std::__cxx11::string::~string((string *)local_438);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&filename.field_2 + 8));
  }
  errStr.field_2._8_8_ = cmsys::SystemTools::Fopen((string *)((long)&url.field_2 + 8),"rb");
  if ((FILE *)errStr.field_2._8_8_ == (FILE *)0x0) {
    cmAlphaNum::cmAlphaNum(&local_4f0,"UPLOAD cannot open file \'");
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&file_size,(string *)((long)&url.field_2 + 8));
    cmStrCat<char[15]>((string *)local_4c0,&local_4f0,(cmAlphaNum *)&file_size,
                       (char (*) [15])"\' for reading.");
    cmExecutionStatus::SetError(local_20,(string *)local_4c0);
    args_local._7_1_ = 0;
    local_250 = 1;
    std::__cxx11::string::~string((string *)local_4c0);
  }
  else {
    local_528 = cmsys::SystemTools::FileLength((string *)((long)&url.field_2 + 8));
    std::__cxx11::string::string((string *)&curl,(string *)&timeout);
    cmCurlFixFileURL(&local_548,(string *)&curl);
    std::__cxx11::string::operator=((string *)&timeout,(string *)&local_548);
    std::__cxx11::string::~string((string *)&local_548);
    std::__cxx11::string::~string((string *)&curl);
    curl_global_init(3);
    local_570 = curl_easy_init();
    pcVar2 = local_20;
    if (local_570 == (CURL_conflict *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_590,"UPLOAD error initializing curl.",
                 (allocator<char> *)((long)&g_curl.Easy + 7));
      cmExecutionStatus::SetError(pcVar2,&local_590);
      std::__cxx11::string::~string((string *)&local_590);
      std::allocator<char>::~allocator((allocator<char> *)((long)&g_curl.Easy + 7));
      fclose((FILE *)errStr.field_2._8_8_);
      args_local._7_1_ = 0;
      local_250 = 1;
    }
    else {
      cURLEasyGuard::cURLEasyGuard((cURLEasyGuard *)&stack0xfffffffffffffa60,local_570);
      e.field_2._12_4_ = curl_easy_setopt(local_570,CURLOPT_FAILONERROR,1);
      if (e.field_2._12_4_ == CURLE_OK) {
        e.field_2._12_4_ = curl_easy_setopt(local_570,CURLOPT_UPLOAD,1);
        pCVar1 = local_570;
        if (e.field_2._12_4_ == CURLE_OK) {
          uVar9 = std::__cxx11::string::c_str();
          e.field_2._12_4_ = curl_easy_setopt(pCVar1,CURLOPT_URL,uVar9);
          if (e.field_2._12_4_ == CURLE_OK) {
            e.field_2._12_4_ =
                 curl_easy_setopt(local_570,CURLOPT_WRITEFUNCTION,cmWriteToMemoryCallback);
            if (e.field_2._12_4_ == CURLE_OK) {
              e.field_2._12_4_ =
                   curl_easy_setopt(local_570,CURLOPT_DEBUGFUNCTION,cmFileCommandCurlDebugCallback);
              if (e.field_2._12_4_ == CURLE_OK) {
                if ((local_f2 & 1) == 0) {
                  e.field_2._12_4_ = curl_easy_setopt(local_570,CURLOPT_SSL_VERIFYPEER,0);
                  if (e.field_2._12_4_ == CURLE_OK) goto LAB_0039aa29;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_6b8,"UPLOAD cannot set TLS/SSL Verify off: ",
                             (allocator<char> *)((long)&cainfo_err + 7));
                  std::allocator<char>::~allocator((allocator<char> *)((long)&cainfo_err + 7));
                  pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                  std::__cxx11::string::operator+=((string *)local_6b8,pcVar8);
                  cmExecutionStatus::SetError(local_20,(string *)local_6b8);
                  args_local._7_1_ = 0;
                  local_250 = 1;
                  std::__cxx11::string::~string((string *)local_6b8);
                }
                else {
                  e.field_2._12_4_ = curl_easy_setopt(local_570,CURLOPT_SSL_VERIFYPEER,1);
                  if (e.field_2._12_4_ == CURLE_OK) {
LAB_0039aa29:
                    pCVar1 = local_570;
                    psVar7 = cmValue::operator_cast_to_string_(&local_128);
                    cmCurlSetCAInfo((string *)
                                    &chunkResponse.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.field_0x10,pCVar1,psVar7);
                    uVar10 = std::__cxx11::string::empty();
                    if ((uVar10 & 1) == 0) {
                      cmExecutionStatus::SetError
                                (local_20,(string *)
                                          &chunkResponse.
                                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                           field_0x10);
                      args_local._7_1_ = 0;
                      local_250 = 1;
                    }
                    else {
                      this_00 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 field_0x10;
                      std::vector<char,_std::allocator<char>_>::vector
                                ((vector<char,_std::allocator<char>_> *)this_00);
                      std::vector<char,_std::allocator<char>_>::vector
                                ((vector<char,_std::allocator<char>_> *)((long)&e_7.field_2 + 8));
                      e.field_2._12_4_ = curl_easy_setopt(local_570,CURLOPT_WRITEDATA,this_00);
                      if (e.field_2._12_4_ == CURLE_OK) {
                        e.field_2._12_4_ =
                             curl_easy_setopt(local_570,CURLOPT_DEBUGDATA,
                                              (undefined1 *)((long)&e_7.field_2 + 8));
                        if (e.field_2._12_4_ == CURLE_OK) {
                          e.field_2._12_4_ = curl_easy_setopt(local_570,CURLOPT_FOLLOWLOCATION,1);
                          if (e.field_2._12_4_ == CURLE_OK) {
                            uVar10 = std::__cxx11::string::empty();
                            if ((uVar10 & 1) == 0) {
                              e.field_2._12_4_ = curl_easy_setopt(local_570,CURLOPT_VERBOSE,1);
                              if (e.field_2._12_4_ != CURLE_OK) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)local_7b0,"UPLOAD cannot set verbose: ",
                                           (allocator<char> *)(e_11.field_2._M_local_buf + 0xf));
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)(e_11.field_2._M_local_buf + 0xf));
                                pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                                std::__cxx11::string::operator+=((string *)local_7b0,pcVar8);
                                cmExecutionStatus::SetError(local_20,(string *)local_7b0);
                                args_local._7_1_ = 0;
                                local_250 = 1;
                                std::__cxx11::string::~string((string *)local_7b0);
                                goto LAB_0039bc06;
                              }
                              e.field_2._12_4_ = 0;
                            }
                            if (0 < inactivity_timeout) {
                              e.field_2._12_4_ =
                                   curl_easy_setopt(local_570,CURLOPT_TIMEOUT,inactivity_timeout);
                              if (e.field_2._12_4_ != CURLE_OK) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)local_7d8,"UPLOAD cannot set timeout: ",
                                           (allocator<char> *)
                                           (helper.Text.field_2._M_local_buf + 0xf));
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)
                                           (helper.Text.field_2._M_local_buf + 0xf));
                                pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                                std::__cxx11::string::operator+=((string *)local_7d8,pcVar8);
                                cmExecutionStatus::SetError(local_20,(string *)local_7d8);
                                args_local._7_1_ = 0;
                                local_250 = 1;
                                std::__cxx11::string::~string((string *)local_7d8);
                                goto LAB_0039bc06;
                              }
                              e.field_2._12_4_ = 0;
                            }
                            if (0 < (long)logVar.field_2._8_8_) {
                              curl_easy_setopt(local_570,CURLOPT_LOW_SPEED_LIMIT,1);
                              curl_easy_setopt(local_570,CURLOPT_LOW_SPEED_TIME,logVar.field_2._8_8_
                                              );
                            }
                            pcVar6 = cmExecutionStatus::GetMakefile(local_20);
                            cURLProgressHelper::cURLProgressHelper
                                      ((cURLProgressHelper *)((long)&e_12.field_2 + 8),pcVar6,
                                       "upload");
                            if ((local_f1 & 1) == 0) {
LAB_0039b3ef:
                              e.field_2._12_4_ =
                                   curl_easy_setopt(local_570,CURLOPT_READDATA,errStr.field_2._8_8_)
                              ;
                              if (e.field_2._12_4_ == CURLE_OK) {
                                e.field_2._12_4_ =
                                     curl_easy_setopt(local_570,CURLOPT_INFILESIZE,local_528);
                                if (e.field_2._12_4_ == CURLE_OK) {
                                  uVar10 = std::__cxx11::string::empty();
                                  pCVar1 = local_570;
                                  if ((uVar10 & 1) == 0) {
                                    uVar9 = std::__cxx11::string::c_str();
                                    e.field_2._12_4_ =
                                         curl_easy_setopt(pCVar1,CURLOPT_USERPWD,uVar9);
                                    if (e.field_2._12_4_ != CURLE_OK) {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)local_8f8,
                                                 "UPLOAD cannot set user password: ",&local_8f9);
                                      std::allocator<char>::~allocator(&local_8f9);
                                      pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                                      std::__cxx11::string::operator+=((string *)local_8f8,pcVar8);
                                      cmExecutionStatus::SetError(local_20,(string *)local_8f8);
                                      args_local._7_1_ = 0;
                                      local_250 = 1;
                                      std::__cxx11::string::~string((string *)local_8f8);
                                      goto LAB_0039bbea;
                                    }
                                  }
                                  cmsys::SystemTools::UpperCase
                                            ((string *)&netrc_option_err,(string *)local_190);
                                  std::__cxx11::string::operator=
                                            ((string *)local_190,(string *)&netrc_option_err);
                                  std::__cxx11::string::~string((string *)&netrc_option_err);
                                  cmCurlSetNETRCOption
                                            ((string *)&headers,local_570,(string *)local_190,
                                             (string *)local_1d8);
                                  local_928 = (string *)&headers;
                                  uVar10 = std::__cxx11::string::empty();
                                  if ((uVar10 & 1) == 0) {
                                    cmExecutionStatus::SetError(local_20,local_928);
                                    args_local._7_1_ = 0;
                                  }
                                  else {
                                    __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)0x0;
                                    __end1 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::begin((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_218);
                                    h = (string *)
                                        std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)local_218);
                                    while( true ) {
                                      bVar3 = __gnu_cxx::operator!=
                                                        (&__end1,(
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&h);
                                      if (!bVar3) break;
                                      local_970 = __gnu_cxx::
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator*(&__end1);
                                      pcVar8 = (char *)std::__cxx11::string::c_str();
                                      __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)curl_slist_append((curl_slist *)__range1,pcVar8)
                                      ;
                                      __gnu_cxx::
                                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ::operator++(&__end1);
                                    }
                                    curl_easy_setopt(local_570,CURLOPT_HTTPHEADER,__range1);
                                    e.field_2._12_4_ = curl_easy_perform(local_570);
                                    curl_slist_free_all((curl_slist *)__range1);
                                    cURLEasyGuard::release
                                              ((cURLEasyGuard *)&stack0xfffffffffffffa60);
                                    curl_easy_cleanup(local_570);
                                    uVar10 = std::__cxx11::string::empty();
                                    if ((uVar10 & 1) == 0) {
                                      pcVar6 = cmExecutionStatus::GetMakefile(local_20);
                                      cmAlphaNum::cmAlphaNum(&local_9d0,e.field_2._12_4_);
                                      cmAlphaNum::cmAlphaNum(&local_a00,";\"");
                                      log.field_2._8_8_ = curl_easy_strerror(e.field_2._12_4_);
                                      cmStrCat<char_const*,char[2]>
                                                (&local_9a0,&local_9d0,&local_a00,
                                                 (char **)((long)&log.field_2 + 8),
                                                 (char (*) [2])0xde515f);
                                      local_980 = (string_view)
                                                  std::__cxx11::string::
                                                  operator_cast_to_basic_string_view
                                                            ((string *)&local_9a0);
                                      cmMakefile::AddDefinition(pcVar6,(string *)local_f0,local_980)
                                      ;
                                      std::__cxx11::string::~string((string *)&local_9a0);
                                    }
                                    curl_global_cleanup();
                                    fclose((FILE *)errStr.field_2._8_8_);
                                    errStr.field_2._8_8_ = 0;
                                    uVar10 = std::__cxx11::string::empty();
                                    if ((uVar10 & 1) == 0) {
                                      std::__cxx11::string::string(local_a28);
                                      bVar3 = std::vector<char,_std::allocator<char>_>::empty
                                                        ((vector<char,_std::allocator<char>_> *)
                                                         &chunkDebug.
                                                                                                                    
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.field_0x10);
                                      if (!bVar3) {
                                        local_a2a[1] = 0;
                                        std::vector<char,_std::allocator<char>_>::push_back
                                                  ((vector<char,_std::allocator<char>_> *)
                                                   &chunkDebug.
                                                    super__Vector_base<char,_std::allocator<char>_>.
                                                    _M_impl.field_0x10,local_a2a + 1);
                                        std::__cxx11::string::operator+=(local_a28,"Response:\n");
                                        pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                           ((vector<char,_std::allocator<char>_> *)
                                                            &chunkDebug.
                                                                                                                          
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.field_0x10);
                                        std::__cxx11::string::operator+=(local_a28,pcVar8);
                                        std::__cxx11::string::operator+=(local_a28,"\n");
                                      }
                                      bVar3 = std::vector<char,_std::allocator<char>_>::empty
                                                        ((vector<char,_std::allocator<char>_> *)
                                                         ((long)&e_7.field_2 + 8));
                                      if (!bVar3) {
                                        local_a2a[0] = '\0';
                                        std::vector<char,_std::allocator<char>_>::push_back
                                                  ((vector<char,_std::allocator<char>_> *)
                                                   ((long)&e_7.field_2 + 8),local_a2a);
                                        std::__cxx11::string::operator+=(local_a28,"Debug:\n");
                                        pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                           ((vector<char,_std::allocator<char>_> *)
                                                            ((long)&e_7.field_2 + 8));
                                        std::__cxx11::string::operator+=(local_a28,pcVar8);
                                        std::__cxx11::string::operator+=(local_a28,"\n");
                                      }
                                      pcVar6 = cmExecutionStatus::GetMakefile(local_20);
                                      sVar11 = (string_view)
                                               std::__cxx11::string::
                                               operator_cast_to_basic_string_view(local_a28);
                                      cmMakefile::AddDefinition
                                                (pcVar6,(string *)((long)&statusVar.field_2 + 8),
                                                 sVar11);
                                      std::__cxx11::string::~string(local_a28);
                                    }
                                    args_local._7_1_ = 1;
                                  }
                                  local_250 = 1;
                                  std::__cxx11::string::~string((string *)&headers);
                                }
                                else {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_8d0,
                                             "UPLOAD cannot set input file size: ",
                                             (allocator<char> *)(e_17.field_2._M_local_buf + 0xf));
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)(e_17.field_2._M_local_buf + 0xf));
                                  pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                                  std::__cxx11::string::operator+=((string *)local_8d0,pcVar8);
                                  cmExecutionStatus::SetError(local_20,(string *)local_8d0);
                                  args_local._7_1_ = 0;
                                  local_250 = 1;
                                  std::__cxx11::string::~string((string *)local_8d0);
                                }
                              }
                              else {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)local_8a8,"UPLOAD cannot set input file: ",
                                           (allocator<char> *)(e_16.field_2._M_local_buf + 0xf));
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)(e_16.field_2._M_local_buf + 0xf));
                                pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                                std::__cxx11::string::operator+=((string *)local_8a8,pcVar8);
                                cmExecutionStatus::SetError(local_20,(string *)local_8a8);
                                args_local._7_1_ = 0;
                                local_250 = 1;
                                std::__cxx11::string::~string((string *)local_8a8);
                              }
                            }
                            else {
                              e.field_2._12_4_ = curl_easy_setopt(local_570,CURLOPT_NOPROGRESS,0);
                              if (e.field_2._12_4_ == CURLE_OK) {
                                e.field_2._12_4_ =
                                     curl_easy_setopt(local_570,CURLOPT_PROGRESSFUNCTION,
                                                      cmFileUploadProgressCallback);
                                if (e.field_2._12_4_ == CURLE_OK) {
                                  e.field_2._12_4_ =
                                       curl_easy_setopt(local_570,CURLOPT_XFERINFODATA,
                                                        (undefined1 *)((long)&e_12.field_2 + 8));
                                  if (e.field_2._12_4_ == CURLE_OK) {
                                    e.field_2._12_4_ = 0;
                                    goto LAB_0039b3ef;
                                  }
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_880,"UPLOAD cannot set progress data: "
                                             ,(allocator<char> *)(e_15.field_2._M_local_buf + 0xf));
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)(e_15.field_2._M_local_buf + 0xf));
                                  pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                                  std::__cxx11::string::operator+=((string *)local_880,pcVar8);
                                  cmExecutionStatus::SetError(local_20,(string *)local_880);
                                  args_local._7_1_ = 0;
                                  local_250 = 1;
                                  std::__cxx11::string::~string((string *)local_880);
                                }
                                else {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_858,
                                             "UPLOAD cannot set progress function: ",
                                             (allocator<char> *)(e_14.field_2._M_local_buf + 0xf));
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)(e_14.field_2._M_local_buf + 0xf));
                                  pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                                  std::__cxx11::string::operator+=((string *)local_858,pcVar8);
                                  cmExecutionStatus::SetError(local_20,(string *)local_858);
                                  args_local._7_1_ = 0;
                                  local_250 = 1;
                                  std::__cxx11::string::~string((string *)local_858);
                                }
                              }
                              else {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)local_830,
                                           "UPLOAD cannot set noprogress value: ",
                                           (allocator<char> *)(e_13.field_2._M_local_buf + 0xf));
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)(e_13.field_2._M_local_buf + 0xf));
                                pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                                std::__cxx11::string::operator+=((string *)local_830,pcVar8);
                                cmExecutionStatus::SetError(local_20,(string *)local_830);
                                args_local._7_1_ = 0;
                                local_250 = 1;
                                std::__cxx11::string::~string((string *)local_830);
                              }
                            }
LAB_0039bbea:
                            cURLProgressHelper::~cURLProgressHelper
                                      ((cURLProgressHelper *)((long)&e_12.field_2 + 8));
                          }
                          else {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)local_788,
                                       "UPLOAD cannot set follow-redirect option: ",
                                       (allocator<char> *)(e_10.field_2._M_local_buf + 0xf));
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)(e_10.field_2._M_local_buf + 0xf));
                            pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                            std::__cxx11::string::operator+=((string *)local_788,pcVar8);
                            cmExecutionStatus::SetError(local_20,(string *)local_788);
                            args_local._7_1_ = 0;
                            local_250 = 1;
                            std::__cxx11::string::~string((string *)local_788);
                          }
                        }
                        else {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)local_760,"UPLOAD cannot set debug data: ",
                                     (allocator<char> *)(e_9.field_2._M_local_buf + 0xf));
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)(e_9.field_2._M_local_buf + 0xf));
                          pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                          std::__cxx11::string::operator+=((string *)local_760,pcVar8);
                          cmExecutionStatus::SetError(local_20,(string *)local_760);
                          args_local._7_1_ = 0;
                          local_250 = 1;
                          std::__cxx11::string::~string((string *)local_760);
                        }
                      }
                      else {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)local_738,"UPLOAD cannot set write data: ",
                                   (allocator<char> *)(e_8.field_2._M_local_buf + 0xf));
                        std::allocator<char>::~allocator
                                  ((allocator<char> *)(e_8.field_2._M_local_buf + 0xf));
                        pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                        std::__cxx11::string::operator+=((string *)local_738,pcVar8);
                        cmExecutionStatus::SetError(local_20,(string *)local_738);
                        args_local._7_1_ = 0;
                        local_250 = 1;
                        std::__cxx11::string::~string((string *)local_738);
                      }
LAB_0039bc06:
                      std::vector<char,_std::allocator<char>_>::~vector
                                ((vector<char,_std::allocator<char>_> *)((long)&e_7.field_2 + 8));
                      std::vector<char,_std::allocator<char>_>::~vector
                                ((vector<char,_std::allocator<char>_> *)
                                 &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                  .field_0x10);
                    }
                    std::__cxx11::string::~string
                              ((string *)
                               &chunkResponse.super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.field_0x10);
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)local_690,"UPLOAD cannot set TLS/SSL Verify on: ",
                               (allocator<char> *)(e_6.field_2._M_local_buf + 0xf));
                    std::allocator<char>::~allocator
                              ((allocator<char> *)(e_6.field_2._M_local_buf + 0xf));
                    pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                    std::__cxx11::string::operator+=((string *)local_690,pcVar8);
                    cmExecutionStatus::SetError(local_20,(string *)local_690);
                    args_local._7_1_ = 0;
                    local_250 = 1;
                    std::__cxx11::string::~string((string *)local_690);
                  }
                }
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_668,"UPLOAD cannot set debug function: ",
                           (allocator<char> *)(e_5.field_2._M_local_buf + 0xf));
                std::allocator<char>::~allocator
                          ((allocator<char> *)(e_5.field_2._M_local_buf + 0xf));
                pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                std::__cxx11::string::operator+=((string *)local_668,pcVar8);
                cmExecutionStatus::SetError(local_20,(string *)local_668);
                args_local._7_1_ = 0;
                local_250 = 1;
                std::__cxx11::string::~string((string *)local_668);
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_640,"UPLOAD cannot set write function: ",
                         (allocator<char> *)(e_4.field_2._M_local_buf + 0xf));
              std::allocator<char>::~allocator((allocator<char> *)(e_4.field_2._M_local_buf + 0xf));
              pcVar8 = curl_easy_strerror(e.field_2._12_4_);
              std::__cxx11::string::operator+=((string *)local_640,pcVar8);
              cmExecutionStatus::SetError(local_20,(string *)local_640);
              args_local._7_1_ = 0;
              local_250 = 1;
              std::__cxx11::string::~string((string *)local_640);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_618,"UPLOAD cannot set url: ",
                       (allocator<char> *)(e_3.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator((allocator<char> *)(e_3.field_2._M_local_buf + 0xf));
            pcVar8 = curl_easy_strerror(e.field_2._12_4_);
            std::__cxx11::string::operator+=((string *)local_618,pcVar8);
            cmExecutionStatus::SetError(local_20,(string *)local_618);
            args_local._7_1_ = 0;
            local_250 = 1;
            std::__cxx11::string::~string((string *)local_618);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_5f0,"UPLOAD cannot set upload flag: ",
                     (allocator<char> *)(e_2.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(e_2.field_2._M_local_buf + 0xf));
          pcVar8 = curl_easy_strerror(e.field_2._12_4_);
          std::__cxx11::string::operator+=((string *)local_5f0,pcVar8);
          cmExecutionStatus::SetError(local_20,(string *)local_5f0);
          args_local._7_1_ = 0;
          local_250 = 1;
          std::__cxx11::string::~string((string *)local_5f0);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_5c8,"UPLOAD cannot set fail on error flag: ",
                   (allocator<char> *)(e_1.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(e_1.field_2._M_local_buf + 0xf));
        pcVar8 = curl_easy_strerror(e.field_2._12_4_);
        std::__cxx11::string::operator+=((string *)local_5c8,pcVar8);
        cmExecutionStatus::SetError(local_20,(string *)local_5c8);
        args_local._7_1_ = 0;
        local_250 = 1;
        std::__cxx11::string::~string((string *)local_5c8);
      }
      cURLEasyGuard::~cURLEasyGuard((cURLEasyGuard *)&stack0xfffffffffffffa60);
    }
  }
LAB_0039bc72:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_218);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::string::~string((string *)(netrc_level.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)(statusVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&timeout);
  std::__cxx11::string::~string((string *)(url.field_2._M_local_buf + 8));
LAB_0039bd30:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleUploadCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)
  if (args.size() < 3) {
    status.SetError("UPLOAD must be called with at least three arguments.");
    return false;
  }
  auto i = args.begin();
  ++i;
  std::string filename = *i;
  ++i;
  std::string url = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool showProgress = false;
  bool tls_verify = status.GetMakefile().IsOn("CMAKE_TLS_VERIFY");
  cmValue cainfo = status.GetMakefile().GetDefinition("CMAKE_TLS_CAINFO");
  std::string userpwd;
  std::string netrc_level =
    status.GetMakefile().GetSafeDefinition("CMAKE_NETRC");
  std::string netrc_file =
    status.GetMakefile().GetSafeDefinition("CMAKE_NETRC_FILE");

  std::vector<std::string> curl_headers;

  while (i != args.end()) {
    if (*i == "TIMEOUT") {
      ++i;
      if (i != args.end()) {
        timeout = atol(i->c_str());
      } else {
        status.SetError("UPLOAD missing time for TIMEOUT.");
        return false;
      }
    } else if (*i == "INACTIVITY_TIMEOUT") {
      ++i;
      if (i != args.end()) {
        inactivity_timeout = atol(i->c_str());
      } else {
        status.SetError("UPLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
      }
    } else if (*i == "LOG") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing VAR for LOG.");
        return false;
      }
      logVar = *i;
    } else if (*i == "STATUS") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing VAR for STATUS.");
        return false;
      }
      statusVar = *i;
    } else if (*i == "SHOW_PROGRESS") {
      showProgress = true;
    } else if (*i == "TLS_VERIFY") {
      ++i;
      if (i != args.end()) {
        tls_verify = cmIsOn(*i);
      } else {
        status.SetError("UPLOAD missing bool value for TLS_VERIFY.");
        return false;
      }
    } else if (*i == "TLS_CAINFO") {
      ++i;
      if (i != args.end()) {
        cainfo = cmValue(*i);
      } else {
        status.SetError("UPLOAD missing file value for TLS_CAINFO.");
        return false;
      }
    } else if (*i == "NETRC_FILE") {
      ++i;
      if (i != args.end()) {
        netrc_file = *i;
      } else {
        status.SetError("UPLOAD missing file value for NETRC_FILE.");
        return false;
      }
    } else if (*i == "NETRC") {
      ++i;
      if (i != args.end()) {
        netrc_level = *i;
      } else {
        status.SetError("UPLOAD missing level value for NETRC.");
        return false;
      }
    } else if (*i == "USERPWD") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing string for USERPWD.");
        return false;
      }
      userpwd = *i;
    } else if (*i == "HTTPHEADER") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing string for HTTPHEADER.");
        return false;
      }
      curl_headers.push_back(*i);
    } else {
      // Do not return error for compatibility reason.
      std::string err = cmStrCat("Unexpected argument: ", *i);
      status.GetMakefile().IssueMessage(MessageType::AUTHOR_WARNING, err);
    }

    ++i;
  }

  // Open file for reading:
  //
  FILE* fin = cmsys::SystemTools::Fopen(filename, "rb");
  if (!fin) {
    std::string errStr =
      cmStrCat("UPLOAD cannot open file '", filename, "' for reading.");
    status.SetError(errStr);
    return false;
  }

  unsigned long file_size = cmsys::SystemTools::FileLength(filename);

  url = cmCurlFixFileURL(url);

  ::CURL* curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if (!curl) {
    status.SetError("UPLOAD error initializing curl.");
    fclose(fin);
    return false;
  }

  cURLEasyGuard g_curl(curl);

  // enable HTTP ERROR parsing
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "UPLOAD cannot set fail on error flag: ");

  // enable uploading
  res = ::curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);
  check_curl_result(res, "UPLOAD cannot set upload flag: ");

  res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "UPLOAD cannot set url: ");

  res =
    ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, cmWriteToMemoryCallback);
  check_curl_result(res, "UPLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "UPLOAD cannot set debug function: ");

  // check to see if TLS verification is requested
  if (tls_verify) {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1);
    check_curl_result(res, "UPLOAD cannot set TLS/SSL Verify on: ");
  } else {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
    check_curl_result(res, "UPLOAD cannot set TLS/SSL Verify off: ");
  }

  // check to see if a CAINFO file has been specified
  // command arg comes first
  std::string const& cainfo_err = cmCurlSetCAInfo(curl, cainfo);
  if (!cainfo_err.empty()) {
    status.SetError(cainfo_err);
    return false;
  }

  cmFileCommandVectorOfChar chunkResponse;
  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, &chunkResponse);
  check_curl_result(res, "UPLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);
  check_curl_result(res, "UPLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "UPLOAD cannot set follow-redirect option: ");

  if (!logVar.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "UPLOAD cannot set verbose: ");
  }

  if (timeout > 0) {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
    check_curl_result(res, "UPLOAD cannot set timeout: ");
  }

  if (inactivity_timeout > 0) {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
  }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(&status.GetMakefile(), "upload");

  if (showProgress) {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "UPLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSFUNCTION,
                             cmFileUploadProgressCallback);
    check_curl_result(res, "UPLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSDATA,
                             reinterpret_cast<void*>(&helper));
    check_curl_result(res, "UPLOAD cannot set progress data: ");
  }

  // now specify which file to upload
  res = ::curl_easy_setopt(curl, CURLOPT_INFILE, fin);
  check_curl_result(res, "UPLOAD cannot set input file: ");

  // and give the size of the upload (optional)
  res =
    ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(file_size));
  check_curl_result(res, "UPLOAD cannot set input file size: ");

  if (!userpwd.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_USERPWD, userpwd.c_str());
    check_curl_result(res, "UPLOAD cannot set user password: ");
  }

  // check to see if netrc parameters have been specified
  // local command args takes precedence over CMAKE_NETRC*
  netrc_level = cmSystemTools::UpperCase(netrc_level);
  std::string const& netrc_option_err =
    cmCurlSetNETRCOption(curl, netrc_level, netrc_file);
  if (!netrc_option_err.empty()) {
    status.SetError(netrc_option_err);
    return false;
  }

  struct curl_slist* headers = nullptr;
  for (std::string const& h : curl_headers) {
    headers = ::curl_slist_append(headers, h.c_str());
  }
  ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

  res = ::curl_easy_perform(curl);

  ::curl_slist_free_all(headers);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if (!statusVar.empty()) {
    status.GetMakefile().AddDefinition(
      statusVar,
      cmStrCat(static_cast<int>(res), ";\"", ::curl_easy_strerror(res), "\""));
  }

  ::curl_global_cleanup();

  fclose(fin);
  fin = nullptr;

  if (!logVar.empty()) {
    std::string log;

    if (!chunkResponse.empty()) {
      chunkResponse.push_back(0);
      log += "Response:\n";
      log += chunkResponse.data();
      log += "\n";
    }

    if (!chunkDebug.empty()) {
      chunkDebug.push_back(0);
      log += "Debug:\n";
      log += chunkDebug.data();
      log += "\n";
    }

    status.GetMakefile().AddDefinition(logVar, log);
  }

  return true;
#else
  status.SetError("UPLOAD not supported by bootstrap cmake.");
  return false;
#endif
}